

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

BlockEntry * __thiscall mkvparser::Segment::GetBlock(Segment *this,CuePoint *cp,TrackPosition *tp)

{
  Cluster **ppCVar1;
  long off;
  bool bVar2;
  Cluster **ppCVar3;
  Cluster *pCluster;
  BlockEntry *pBVar4;
  long lVar5;
  Cluster **ppCVar6;
  
  ppCVar6 = this->m_clusters;
  ppCVar3 = ppCVar6 + this->m_clusterCount + this->m_clusterPreloadCount;
  off = tp->m_pos;
  if (ppCVar6 < ppCVar3) {
    do {
      ppCVar1 = (Cluster **)
                ((long)ppCVar6 +
                (((long)ppCVar3 - (long)ppCVar6 >> 3) - ((long)ppCVar3 - (long)ppCVar6 >> 0x3f) &
                0xfffffffffffffffeU) * 4);
      pCluster = *ppCVar1;
      lVar5 = pCluster->m_element_start - pCluster->m_pSegment->m_start;
      if (lVar5 < off) {
        ppCVar6 = ppCVar1 + 1;
      }
      else {
        ppCVar3 = ppCVar1;
        if (lVar5 <= off) goto LAB_0015df7a;
      }
    } while (ppCVar6 < ppCVar3);
  }
  pCluster = Cluster::Create(this,-1,off);
  if (pCluster != (Cluster *)0x0) {
    bVar2 = PreloadCluster(this,pCluster,(long)ppCVar6 - (long)this->m_clusters >> 3);
    if (bVar2) {
LAB_0015df7a:
      pBVar4 = Cluster::GetEntry(pCluster,cp,tp);
      return pBVar4;
    }
    Cluster::~Cluster(pCluster);
    operator_delete(pCluster);
  }
  return (BlockEntry *)0x0;
}

Assistant:

const BlockEntry* Segment::GetBlock(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) {
  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < tp.m_pos)
      i = k + 1;
    else if (pos > tp.m_pos)
      j = k;
    else
      return pCluster->GetEntry(cp, tp);
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, tp.m_pos);  //, -1);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster->GetEntry(cp, tp);
}